

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void __thiscall
Diffusion::FillBoundary
          (Diffusion *this,BndryRegister *bdry,int state_ind,int dest_comp,int num_comp,Real time,
          int rho_flag)

{
  BoxArray *pBVar1;
  MFInfo *info;
  NavierStokesBase *in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  Real in_stack_00000008;
  int in_stack_00000014;
  MultiFab *in_stack_00000018;
  AmrLevel *in_stack_00000020;
  int in_stack_00000030;
  int n;
  MultiFab S;
  MultiFab *rhotime;
  int nGrow;
  AmrLevel *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  int in_stack_fffffffffffffdf8;
  int ncomp;
  BndryRegister *this_00;
  undefined4 in_stack_fffffffffffffe08;
  int iVar2;
  undefined4 in_stack_fffffffffffffe0c;
  MultiFab *in_stack_fffffffffffffe10;
  _func_int **local_1e8;
  FabFactory<amrex::FArrayBox> *factory;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDI;
  NavierStokesBase::get_rho
            (in_RDI,(Real)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  iVar2 = (int)((ulong)_Var3._M_pi >> 0x20);
  pBVar1 = amrex::AmrLevel::boxArray(*(AmrLevel **)&(in_RDI->super_AmrLevel).level);
  info = (MFInfo *)amrex::AmrLevel::DistributionMap(*(AmrLevel **)&(in_RDI->super_AmrLevel).level);
  local_1e8 = (_func_int **)0x0;
  factory = (FabFactory<amrex::FArrayBox> *)0x0;
  this_00 = (BndryRegister *)&stack0xfffffffffffffe18;
  ncomp = in_R8D;
  amrex::MFInfo::MFInfo((MFInfo *)0x86bf5c);
  amrex::AmrLevel::Factory(in_stack_fffffffffffffdd0);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffffe10,
             (BoxArray *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             (DistributionMapping *)this_00,ncomp,in_stack_fffffffffffffdf8,info,factory);
  amrex::MFInfo::~MFInfo((MFInfo *)0x86bfa5);
  amrex::AmrLevel::FillPatch
            (in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000008,
             unaff_retaddr_00,unaff_retaddr,iVar2,in_stack_00000030);
  if (in_R9D == 2) {
    for (iVar2 = 0; iVar2 < in_R8D; iVar2 = iVar2 + 1) {
      amrex::MultiFab::Divide
                ((MultiFab *)this_00,(MultiFab *)CONCAT44(ncomp,in_stack_fffffffffffffdf8),
                 (int)((ulong)info >> 0x20),(int)info,(int)((ulong)pBVar1 >> 0x20),(int)pBVar1);
    }
  }
  amrex::Periodicity::NonPeriodic();
  amrex::BndryRegister::copyFrom
            (this_00,(MultiFab *)CONCAT44(ncomp,in_stack_fffffffffffffdf8),
             (int)((ulong)info >> 0x20),(int)info,(int)((ulong)pBVar1 >> 0x20),(int)pBVar1,
             (Periodicity *)in_stack_fffffffffffffe10);
  amrex::MultiFab::~MultiFab((MultiFab *)0x86c0dd);
  return;
}

Assistant:

void
Diffusion::FillBoundary (BndryRegister& bdry,
                         int            state_ind,
                         int            dest_comp,
                         int            num_comp,
                         Real           time,
                         int            rho_flag)
{
    //
    // Need one grow cell filled for linear solvers.
    // We assume filPatch gets this right, where possible.
    //
    const int     nGrow = 1;

    const MultiFab& rhotime = navier_stokes->get_rho(time);

    MultiFab S(navier_stokes->boxArray(),
               navier_stokes->DistributionMap(),
               num_comp,nGrow,MFInfo(),navier_stokes->Factory());

    AmrLevel::FillPatch(*navier_stokes,S,nGrow,time,State_Type,state_ind,num_comp);

    if (rho_flag == 2) {
        for (int n = 0; n < num_comp; ++n) {
	    MultiFab::Divide(S,rhotime,0,n,1,nGrow);
	}
    }

    //
    // Copy into boundary register.
    //
    bdry.copyFrom(S,nGrow,0,dest_comp,num_comp);

}